

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# region.hpp
# Opt level: O0

string * __thiscall
toml::detail::location<std::vector<char,std::allocator<char>>>::name_abi_cxx11_
          (string *__return_storage_ptr__,void *this)

{
  location<std::vector<char,_std::allocator<char>_>_> *this_local;
  
  std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)((long)this + 0x20));
  return __return_storage_ptr__;
}

Assistant:

std::string name() const override {return source_name_;}